

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O1

int Maj_ManExactSynthesis(int nVars,int nNodes,int fUseConst,int fUseLine,int fVerbose)

{
  int iVar1;
  word *pwVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Maj_Man_t *p;
  int iVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int (*paaiVar14) [3] [32];
  long lVar15;
  bool bVar16;
  int iMint;
  timespec ts;
  uint local_80;
  uint local_7c;
  timespec local_78;
  long local_68;
  long local_58;
  int local_4c;
  int (*local_48) [3] [32];
  int (*local_40) [3] [32];
  long local_38;
  
  local_80 = 0;
  local_4c = fVerbose;
  iVar4 = clock_gettime(3,&local_78);
  if (iVar4 < 0) {
    local_58 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_58 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  p = Maj_ManAlloc(nVars,nNodes,fUseConst,fUseLine);
  iVar4 = Maj_ManAddCnfStart(p);
  if (iVar4 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                  ,0x174,"int Maj_ManExactSynthesis(int, int, int, int, int)");
  }
  printf("Running exact synthesis for %d-input majority with %d MAJ3 gates...\n",
         (ulong)(uint)p->nVars,(ulong)(uint)p->nNodes);
  if (local_80 != 0xffffffff) {
    local_48 = p->VarMarks + 2;
    local_7c = 0;
    do {
      iVar4 = clock_gettime(3,&local_78);
      if (iVar4 < 0) {
        lVar8 = 1;
      }
      else {
        lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
        lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_78.tv_sec * -1000000;
      }
      iVar4 = Maj_ManAddCnf(p,local_80);
      if (iVar4 == 0) break;
      iVar4 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
      if (local_4c != 0) {
        printf("Iter %3d : ",(ulong)local_7c);
        Extra_PrintBinary(_stdout,&local_80,p->nVars);
        printf("  Var =%5d  ",(ulong)(uint)p->iVar);
        uVar5 = bmcg_sat_solver_clausenum(p->pSat);
        printf("Cla =%6d  ",(ulong)uVar5);
        uVar5 = bmcg_sat_solver_conflictnum(p->pSat);
        printf("Conf =%9d  ",(ulong)uVar5);
        iVar7 = 3;
        iVar6 = clock_gettime(3,&local_78);
        if (iVar6 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
        }
        Abc_Print(iVar7,"%s =","Time");
        Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar15 + lVar8) / 1000000.0);
      }
      if (iVar4 == -1) {
        puts("The problem has no solution.");
        break;
      }
      iVar4 = p->nVars;
      iVar6 = p->nObjs;
      if (iVar4 + 2 < iVar6) {
        lVar8 = (long)iVar4 + 2;
        paaiVar14 = local_48 + iVar4;
        do {
          lVar15 = 0;
          local_40 = paaiVar14;
          local_38 = lVar8;
          do {
            uVar5 = 0;
            if (p->nObjs < 1) {
              iVar4 = -1;
            }
            else {
              uVar11 = 0xffffffff;
              uVar9 = 0;
              do {
                iVar4 = (*paaiVar14)[0][uVar9];
                if (iVar4 != 0) {
                  iVar4 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar4);
                  if (iVar4 != 0) {
                    uVar11 = uVar9 & 0xffffffff;
                  }
                  uVar5 = uVar5 + (iVar4 != 0);
                }
                iVar4 = (int)uVar11;
                uVar9 = uVar9 + 1;
              } while ((long)uVar9 < (long)p->nObjs);
              uVar5 = (uint)(uVar5 == 1);
            }
            if ((char)uVar5 == '\0') {
              __assert_fail("Count == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                            ,0xb6,"int Maj_ManFindFanin(Maj_Man_t *, int, int)");
            }
            uVar5 = p->nWords;
            uVar10 = iVar4 * uVar5;
            if ((int)uVar10 < 0) goto LAB_0059adca;
            iVar4 = p->vInfo->nSize;
            if (iVar4 <= (int)uVar10) goto LAB_0059adca;
            pwVar2 = p->vInfo->pArray;
            (&local_78.tv_sec)[lVar15] = (__time_t)(pwVar2 + uVar10);
            lVar15 = lVar15 + 1;
            paaiVar14 = (int (*) [3] [32])(*paaiVar14 + 1);
          } while (lVar15 != 3);
          iVar6 = (int)local_38 * uVar5;
          if ((iVar6 < 0) || (iVar4 <= iVar6)) goto LAB_0059adca;
          if (0 < (int)uVar5) {
            uVar9 = 0;
            do {
              uVar11 = *(ulong *)(local_78.tv_nsec + uVar9 * 8);
              uVar3 = *(ulong *)(local_68 + uVar9 * 8);
              pwVar2[(int)local_38 * uVar5 + uVar9] =
                   uVar3 & uVar11 | (uVar3 | uVar11) & *(ulong *)(local_78.tv_sec + uVar9 * 8);
              uVar9 = uVar9 + 1;
            } while (uVar5 != uVar9);
          }
          lVar8 = local_38 + 1;
          iVar6 = p->nObjs;
          paaiVar14 = local_40 + 1;
        } while (lVar8 < iVar6);
      }
      iVar4 = p->nVars;
      iVar7 = 1 << ((byte)iVar4 & 0x1f);
      uVar9 = 0xffffffff;
      uVar5 = 0xffffffff;
      if (iVar4 != 0x1f) {
        iVar12 = 1;
        if (1 < iVar7) {
          iVar12 = iVar7;
        }
        uVar11 = 0;
        do {
          iVar13 = (int)uVar11;
          if (iVar4 / 2 + 1 < Abc_TtBitCount8[uVar11 >> 8] + Abc_TtBitCount8[uVar11 & 0xff] ||
              Abc_TtBitCount8[uVar11 >> 8] + Abc_TtBitCount8[uVar11 & 0xff] < iVar4 / 2) {
            bVar16 = false;
          }
          else {
            uVar5 = p->nWords * iVar6;
            if ((int)uVar5 < 0) {
LAB_0059adca:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            iVar1 = p->vInfo->nSize;
            if (((iVar1 <= (int)uVar5) || (uVar10 = p->nWords * (iVar6 + -1), (int)uVar10 < 0)) ||
               (iVar1 <= (int)uVar10)) goto LAB_0059adca;
            pwVar2 = p->vInfo->pArray;
            bVar16 = ((pwVar2[(ulong)uVar10 + (uVar11 >> 6)] ^ pwVar2[(ulong)uVar5 + (uVar11 >> 6)])
                      >> (uVar11 & 0x3f) & 1) != 0;
            if (bVar16) {
              uVar9 = uVar11;
            }
          }
          uVar5 = (uint)uVar9;
        } while ((!bVar16) && (uVar11 = (ulong)(iVar13 + 1), iVar12 + -1 != iVar13));
      }
      if (iVar7 <= (int)uVar5) {
        __assert_fail("iMint < (1 << p->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                      ,0xda,"int Maj_ManEval(Maj_Man_t *)");
      }
      local_7c = local_7c + 1;
      local_80 = uVar5;
    } while (uVar5 != 0xffffffff);
  }
  if (local_80 == 0xffffffff) {
    Maj_ManPrintSolution(p);
  }
  Maj_ManFree(p);
  iVar6 = 3;
  iVar4 = clock_gettime(3,&local_78);
  if (iVar4 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  lVar8 = lVar8 + local_58;
  Abc_Print(iVar6,"%s =","Total runtime");
  Abc_Print(iVar6,"%9.2f sec\n",(double)lVar8 / 1000000.0);
  return (int)(local_80 == 0xffffffff);
}

Assistant:

int Maj_ManExactSynthesis( int nVars, int nNodes, int fUseConst, int fUseLine, int fVerbose )
{
    int i, iMint = 0;
    abctime clkTotal = Abc_Clock();
    Maj_Man_t * p = Maj_ManAlloc( nVars, nNodes, fUseConst, fUseLine );
    int status = Maj_ManAddCnfStart( p );
    assert( status );
    printf( "Running exact synthesis for %d-input majority with %d MAJ3 gates...\n", p->nVars, p->nNodes );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Maj_ManAddCnf( p, iMint ) )
            break;
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", bmcg_sat_solver_clausenum(p->pSat) );
            printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == GLUCOSE_UNSAT )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Maj_ManEval( p );
    }
    if ( iMint == -1 )
        Maj_ManPrintSolution( p );
    Maj_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return iMint == -1;
}